

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_function.hpp
# Opt level: O0

void __thiscall duckdb::CopyFunction::CopyFunction(CopyFunction *this,string *name)

{
  string *in_RSI;
  Function *in_RDI;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  duckdb::Function::Function(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  *(undefined ***)in_RDI = &PTR__CopyFunction_00c00100;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  *(undefined8 *)(in_RDI + 0x88) = 0;
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = 0;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  *(undefined8 *)(in_RDI + 200) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  duckdb::TableFunction::TableFunction((TableFunction *)(in_RDI + 0xd8));
  std::__cxx11::string::string((string *)(in_RDI + 0x290));
  return;
}

Assistant:

explicit CopyFunction(const string &name)
	    : Function(name), plan(nullptr), copy_to_select(nullptr), copy_to_bind(nullptr),
	      copy_to_initialize_local(nullptr), copy_to_initialize_global(nullptr),
	      copy_to_get_written_statistics(nullptr), copy_to_sink(nullptr), copy_to_combine(nullptr),
	      copy_to_finalize(nullptr), execution_mode(nullptr), prepare_batch(nullptr), flush_batch(nullptr),
	      desired_batch_size(nullptr), rotate_files(nullptr), rotate_next_file(nullptr), serialize(nullptr),
	      deserialize(nullptr), copy_from_bind(nullptr) {
	}